

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O2

int Min_SopCheck(Min_Man_t *p)

{
  int iVar1;
  int iVar2;
  Min_Cube_t *pCube1;
  long lVar3;
  Min_Cube_t *pCube0;
  int iVar4;
  
  pCube1 = Min_CubeAlloc(p);
  pCube1->uData[0] = pCube1->uData[0] ^ 0x295a;
  *(uint *)&pCube1->field_0x8 = *(uint *)&pCube1->field_0x8 & 0x3fffff | 0x1c00000;
  iVar1 = p->nVars;
  iVar4 = 0;
  lVar3 = 0;
  do {
    if (iVar1 < lVar3) {
LAB_00384f43:
      Min_CubeRecycle(p,pCube1);
      return iVar4;
    }
    pCube0 = (Min_Cube_t *)(p->ppStore + lVar3);
    while (pCube0 = pCube0->pNext, pCube0 != (Min_Cube_t *)0x0) {
      if (pCube0 != p->pBubble) {
        iVar2 = Min_CubeIsContained(pCube0,pCube1);
        if (iVar2 != 0) {
          iVar4 = 1;
          goto LAB_00384f43;
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int Min_SopCheck( Min_Man_t * p )
{
    Min_Cube_t * pCube, * pThis;
    int i;

    pCube = Min_CubeAlloc( p );
    Min_CubeXorBit( pCube, 2*0+1 );
    Min_CubeXorBit( pCube, 2*1+1 );
    Min_CubeXorBit( pCube, 2*2+0 );
    Min_CubeXorBit( pCube, 2*3+0 );
    Min_CubeXorBit( pCube, 2*4+0 );
    Min_CubeXorBit( pCube, 2*5+1 );
    Min_CubeXorBit( pCube, 2*6+1 );
    pCube->nLits = 7;

//    Min_CubeWrite( stdout, pCube );

    // check that the cubes contain it
    for ( i = 0; i <= p->nVars; i++ )
        Min_CoverForEachCube( p->ppStore[i], pThis )
            if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
            {
                Min_CubeRecycle( p, pCube );
                return 1;
            }
    Min_CubeRecycle( p, pCube );
    return 0;
}